

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

string * __thiscall
CLI::Option::help_aftername_abi_cxx11_(string *__return_storage_ptr__,Option *this)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  reference ppOVar5;
  string local_230;
  Option *local_210;
  Option *opt_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  Option *local_1d0;
  Option *opt;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  stringstream local_1a0 [8];
  stringstream out;
  ostream local_190 [376];
  Option *local_18;
  Option *this_local;
  
  local_18 = this;
  this_local = (Option *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  iVar2 = get_expected(this);
  if (iVar2 != 0) {
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar4 = ::std::operator<<(local_190," ");
      ::std::operator<<(poVar4,(string *)&this->typeval_);
    }
    uVar3 = ::std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar4 = ::std::operator<<(local_190,"=");
      ::std::operator<<(poVar4,(string *)&this->defaultval_);
    }
    iVar2 = get_expected(this);
    if (1 < iVar2) {
      poVar4 = ::std::operator<<(local_190," x ");
      iVar2 = get_expected(this);
      ::std::ostream::operator<<(poVar4,iVar2);
    }
    iVar2 = get_expected(this);
    if (iVar2 == -1) {
      ::std::operator<<(local_190," ...");
    }
  }
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = ::std::operator<<(local_190," (env:");
    poVar4 = ::std::operator<<(poVar4,(string *)&this->envname_);
    ::std::operator<<(poVar4,")");
  }
  bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                    (&this->requires_);
  if (!bVar1) {
    ::std::operator<<(local_190," Requires:");
    __end3 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
             begin(&this->requires_);
    opt = (Option *)
          std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                    (&this->requires_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&opt), bVar1) {
      ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3);
      local_1d0 = *ppOVar5;
      poVar4 = ::std::operator<<(local_190," ");
      get_name_abi_cxx11_((string *)&__range3_1,local_1d0,false);
      ::std::operator<<(poVar4,(string *)&__range3_1);
      ::std::__cxx11::string::~string((string *)&__range3_1);
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3);
    }
  }
  bVar1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                    (&this->excludes_);
  if (!bVar1) {
    ::std::operator<<(local_190," Excludes:");
    __end3_1 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::
               begin(&this->excludes_);
    opt_1 = (Option *)
            std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                      (&this->excludes_);
    while (bVar1 = std::operator!=(&__end3_1,(_Self *)&opt_1), bVar1) {
      ppOVar5 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(&__end3_1);
      local_210 = *ppOVar5;
      poVar4 = ::std::operator<<(local_190," ");
      get_name_abi_cxx11_(&local_230,local_210,false);
      ::std::operator<<(poVar4,(string *)&local_230);
      ::std::__cxx11::string::~string((string *)&local_230);
      std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(&__end3_1);
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string help_aftername() const {
        std::stringstream out;

        if(get_expected() != 0) {
            if(!typeval_.empty())
                out << " " << typeval_;
            if(!defaultval_.empty())
                out << "=" << defaultval_;
            if(get_expected() > 1)
                out << " x " << get_expected();
            if(get_expected() == -1)
                out << " ...";
        }
        if(!envname_.empty())
            out << " (env:" << envname_ << ")";
        if(!requires_.empty()) {
            out << " Requires:";
            for(const Option *opt : requires_)
                out << " " << opt->get_name();
        }
        if(!excludes_.empty()) {
            out << " Excludes:";
            for(const Option *opt : excludes_)
                out << " " << opt->get_name();
        }
        return out.str();
    }